

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O0

bool __thiscall QTreeWidgetItem::isFirstColumnSpanned(QTreeWidgetItem *this)

{
  int iVar1;
  QTreeModel *this_00;
  QTreeWidgetItem *in_RDI;
  long in_FS_OFFSET;
  QTreeModel *model;
  QModelIndex index;
  QTreeWidget *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int row;
  bool local_39;
  undefined1 local_20 [16];
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_10;
  QTreeWidgetItem *local_8;
  
  local_8 = *(QTreeWidgetItem **)(in_FS_OFFSET + 0x28);
  this_00 = treeModel((QTreeWidgetItem *)
                      CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff98);
  if ((this_00 == (QTreeModel *)0x0) || (in_RDI == this_00->headerItem)) {
    local_39 = false;
  }
  else {
    local_20._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_20._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_10.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    QTreeModel::index((QTreeModel *)local_20,(char *)this_00,(int)in_RDI);
    row = (int)((ulong)in_RDI >> 0x20);
    iVar1 = QModelIndex::row((QModelIndex *)local_20);
    QModelIndex::parent((QModelIndex *)CONCAT44(iVar1,in_stack_ffffffffffffffa0));
    local_39 = QTreeView::isFirstColumnSpanned
                         ((QTreeView *)this_00,row,
                          (QModelIndex *)CONCAT44(iVar1,in_stack_ffffffffffffffa0));
  }
  if (*(QTreeWidgetItem **)(in_FS_OFFSET + 0x28) == local_8) {
    return local_39;
  }
  __stack_chk_fail();
}

Assistant:

bool QTreeWidgetItem::isFirstColumnSpanned() const
{
    const QTreeModel *model = treeModel();
    if (!model || this == model->headerItem)
        return false;
    const QModelIndex index = model->index(this, 0);
    return view->isFirstColumnSpanned(index.row(), index.parent());
}